

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLAbstractDoubleFloat::formatString(XMLAbstractDoubleFloat *this)

{
  XMLCh *target;
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLSize_t i;
  long lVar3;
  XMLCh *pXVar4;
  
  XVar2 = XMLString::stringLen(this->fRawData);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar2 * 2 + 0x10);
  pXVar4 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  this->fFormattedString = pXVar4;
  for (lVar3 = 0; XVar2 + 8 != lVar3; lVar3 = lVar3 + 1) {
    pXVar4[lVar3] = L'\0';
  }
  XMLString::copyString(pXVar4,this->fRawData);
  target = this->fFormattedString;
  pXVar4 = target + XVar2;
  pXVar4[0] = L' ';
  pXVar4[1] = L'(';
  if ((ulong)this->fType < 3) {
    pXVar4 = (XMLCh *)(&PTR_fgNegINFString_003fae80)[this->fType];
  }
  else {
    pXVar4 = L"0";
  }
  XMLString::catString(target,pXVar4);
  pXVar4 = this->fFormattedString;
  XVar2 = XMLString::stringLen(pXVar4);
  pXVar4[XVar2] = L')';
  return;
}

Assistant:

void XMLAbstractDoubleFloat::formatString()
{

    XMLSize_t rawDataLen = XMLString::stringLen(fRawData);
    fFormattedString = (XMLCh*) fMemoryManager->allocate
    (
        (rawDataLen + 8) * sizeof(XMLCh)
    );//new XMLCh [ rawDataLen + 8];
    for (XMLSize_t i = 0; i < rawDataLen + 8; i++)
        fFormattedString[i] = chNull;

    XMLString::copyString(fFormattedString, fRawData);

    fFormattedString[rawDataLen] = chSpace;
    fFormattedString[rawDataLen + 1] = chOpenParen;

    switch (fType)
    {
    case NegINF:       
        XMLString::catString(fFormattedString, XMLUni::fgNegINFString);
        break;
    case PosINF:
        XMLString::catString(fFormattedString, XMLUni::fgPosINFString);
        break;
    case NaN:
        XMLString::catString(fFormattedString, XMLUni::fgNaNString);
        break;
    default:
        // its zero
        XMLString::catString(fFormattedString, XMLUni::fgPosZeroString);
        break;
    }

    fFormattedString[XMLString::stringLen(fFormattedString)] = chCloseParen;

}